

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Swap.h
# Opt level: O2

void __thiscall
Eigen::SwapWrapper<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>>::
copyPacket<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>,1,1>
          (SwapWrapper<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>> *this,Index rowId,
          Index colId,
          DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_> *other)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  
  lVar6 = (*(long **)this)[3] * colId * 8 + **(long **)this;
  puVar1 = (undefined8 *)(lVar6 + rowId * 8);
  uVar3 = *puVar1;
  uVar4 = puVar1[1];
  puVar1 = (undefined8 *)(*(long *)(other + 0x18) * colId * 8 + *(long *)other + rowId * 8);
  uVar5 = puVar1[1];
  puVar2 = (undefined8 *)(lVar6 + rowId * 8);
  *puVar2 = *puVar1;
  puVar2[1] = uVar5;
  puVar1 = (undefined8 *)(colId * *(long *)(other + 0x18) * 8 + *(long *)other + rowId * 8);
  *puVar1 = uVar3;
  puVar1[1] = uVar4;
  return;
}

Assistant:

void copyPacket(Index rowId, Index colId, const DenseBase<OtherDerived>& other)
    {
      OtherDerived& _other = other.const_cast_derived();
      eigen_internal_assert(rowId >= 0 && rowId < rows()
                        && colId >= 0 && colId < cols());
      Packet tmp = m_expression.template packet<StoreMode>(rowId, colId);
      m_expression.template writePacket<StoreMode>(rowId, colId,
        _other.template packet<LoadMode>(rowId, colId)
      );
      _other.template writePacket<LoadMode>(rowId, colId, tmp);
    }